

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::BeginElemSegmentInitExpr(BinaryReaderIR *this,Index index)

{
  pointer ppEVar1;
  Result RVar2;
  
  ppEVar1 = (this->module_->elem_segments).
            super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (((long)(this->module_->elem_segments).
             super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)ppEVar1 >> 3) - 1U == (ulong)index) {
    RVar2 = PushLabel(this,InitExpr,&ppEVar1[index]->offset,(Expr *)0x0);
    return (Result)RVar2.enum_;
  }
  __assert_fail("index == module_->elem_segments.size() - 1",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/binary-reader-ir.cc"
                ,0x579,
                "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::BeginElemSegmentInitExpr(Index)"
               );
}

Assistant:

Result BinaryReaderIR::BeginElemSegmentInitExpr(Index index) {
  assert(index == module_->elem_segments.size() - 1);
  ElemSegment* segment = module_->elem_segments[index];
  return BeginInitExpr(&segment->offset);
}